

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O2

ON_SubDVertex * __thiscall
ON_SubD_FixedSizeHeap::AllocateSectorFaceVertex
          (ON_SubD_FixedSizeHeap *this,ON_SubDFace *sector_face0)

{
  bool bVar1;
  uint uVar2;
  ON_SubDVertex *this_00;
  double subdP [3];
  
  if (((sector_face0 != (ON_SubDFace *)0x0) &&
      (bVar1 = ON_SubDFace::GetSubdivisionPoint(sector_face0,subdP), bVar1)) &&
     (this_00 = AllocateVertex(this,subdP,3), this_00 != (ON_SubDVertex *)0x0)) {
    uVar2 = ON_SubDComponentBase::SubdivisionLevel(&sector_face0->super_ON_SubDComponentBase);
    ON_SubDComponentBase::SetSubdivisionLevel(&this_00->super_ON_SubDComponentBase,uVar2 + 1);
    this_00->m_vertex_tag = Smooth;
    return this_00;
  }
  ON_SubDIncrementErrorCount();
  return (ON_SubDVertex *)0x0;
}

Assistant:

ON_SubDVertex * ON_SubD_FixedSizeHeap::AllocateSectorFaceVertex(const ON_SubDFace * sector_face0)
{
  if (nullptr == sector_face0)
    return ON_SUBD_RETURN_ERROR(nullptr);
  double subdP[3];
  if (false == sector_face0->GetSubdivisionPoint(subdP))
    return ON_SUBD_RETURN_ERROR(nullptr);

  ON_SubDVertex* v1 = AllocateVertex(subdP, 3 );
  if (nullptr == v1)
    return ON_SUBD_RETURN_ERROR(nullptr);

  v1->SetSubdivisionLevel( sector_face0->SubdivisionLevel() + 1 );
  v1->m_vertex_tag = ON_SubDVertexTag::Smooth;
  return v1;
}